

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O1

void Dch_DeriveChoiceAigNode
               (Aig_Man_t *pAigNew,Aig_Man_t *pAigOld,Aig_Obj_t *pObj,int fSkipRedSupps)

{
  int *piVar1;
  Aig_Obj_t **ppAVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  Aig_Obj_t *pAVar6;
  anon_union_8_3_a781e0d5_for_Aig_Obj_t__13 aVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  Aig_Obj_t *pAVar10;
  anon_union_8_3_a781e0d5_for_Aig_Obj_t__13 aVar11;
  bool bVar12;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/dch/dchChoice.c"
                  ,0x1be,"void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)")
    ;
  }
  if (pAigOld->pReprs == (Aig_Obj_t **)0x0) {
    pAVar10 = (Aig_Obj_t *)0x0;
  }
  else {
    pAVar10 = pAigOld->pReprs[pObj->Id];
  }
  if (pAVar10 != (Aig_Obj_t *)0x0) {
    if (((ulong)pAVar10 & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                    ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
    }
    uVar3 = (uint)*(undefined8 *)&pAVar10->field_0x18;
    if ((ulong)(uVar3 & 7) - 1 < 2) {
      if ((pAVar10->field_5).pData != (void *)0x0) {
        (pObj->field_5).pData =
             (void *)((ulong)((uVar3 ^ *(uint *)&pObj->field_0x18) >> 3 & 1) ^
                     (ulong)(pAVar10->field_5).pData);
        return;
      }
      __assert_fail("pRepr->pData != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/dch/dchChoice.c"
                    ,0x1c3,
                    "void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)");
    }
  }
  uVar5 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
  if (uVar5 == 0) {
    pAVar9 = (Aig_Obj_t *)0x0;
  }
  else {
    pAVar9 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar5 + 0x28));
  }
  ppAVar2 = pAigNew->pReprs;
  if (ppAVar2 == (Aig_Obj_t **)0x0) {
    pAVar8 = (Aig_Obj_t *)0x0;
  }
  else {
    pAVar8 = ppAVar2[*(int *)(((ulong)pAVar9 & 0xfffffffffffffffe) + 0x24)];
  }
  if (pAVar8 != (Aig_Obj_t *)0x0) {
    pAVar9 = (Aig_Obj_t *)
             ((ulong)(((uint)pAVar9 ^
                      (*(uint *)&pAVar8->field_0x18 ^
                      *(uint *)(((ulong)pAVar9 & 0xfffffffffffffffe) + 0x18)) >> 3) & 1) ^
             (ulong)pAVar8);
  }
  uVar5 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
  if (uVar5 == 0) {
    pAVar8 = (Aig_Obj_t *)0x0;
  }
  else {
    pAVar8 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ *(ulong *)(uVar5 + 0x28));
  }
  if (ppAVar2 == (Aig_Obj_t **)0x0) {
    pAVar6 = (Aig_Obj_t *)0x0;
  }
  else {
    pAVar6 = ppAVar2[*(int *)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x24)];
  }
  if (pAVar6 != (Aig_Obj_t *)0x0) {
    pAVar8 = (Aig_Obj_t *)
             ((ulong)(((uint)pAVar8 ^
                      (*(uint *)&pAVar6->field_0x18 ^
                      *(uint *)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x18)) >> 3) & 1) ^
             (ulong)pAVar6);
  }
  aVar7.pData = Aig_And(pAigNew,pAVar9,pAVar8);
  do {
    if (pAigNew->pReprs == (Aig_Obj_t **)0x0) {
      pAVar9 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar9 = pAigNew->pReprs[*(int *)(((ulong)aVar7.pData & 0xfffffffffffffffe) + 0x24)];
    }
    aVar11 = aVar7;
    if (pAVar9 != (Aig_Obj_t *)0x0) {
      aVar11.pData = (void *)((ulong)((aVar7.iData ^
                                      (*(uint *)&pAVar9->field_0x18 ^
                                      *(uint *)(((ulong)aVar7.pData & 0xfffffffffffffffe) + 0x18))
                                      >> 3) & 1) ^ (ulong)pAVar9);
    }
    bVar12 = aVar11.pData != aVar7.pData;
    aVar7 = aVar11;
  } while (bVar12);
  if ((pObj->field_5).pData != (void *)0x0) {
    __assert_fail("pObj->pData == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/dch/dchChoice.c"
                  ,0x1d5,"void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)")
    ;
  }
  pObj->field_5 = aVar11;
  if (pAVar10 != (Aig_Obj_t *)0x0) {
    if (pObj->Id <= pAVar10->Id) {
      __assert_fail("pRepr->Id < pObj->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/dch/dchChoice.c"
                    ,0x1da,
                    "void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)");
    }
    if ((*(uint *)&pAVar10->field_0x18 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pRepr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/dch/dchChoice.c"
                    ,0x1db,
                    "void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)");
    }
    pAVar9 = (Aig_Obj_t *)((ulong)aVar11.pData & 0xfffffffffffffffe);
    pAVar10 = (Aig_Obj_t *)((ulong)(pAVar10->field_5).pData & 0xfffffffffffffffe);
    if (pAVar10->Id < pAVar9->Id) {
      if (pAigNew->pReprs == (Aig_Obj_t **)0x0) {
        __assert_fail("p->pReprs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                      ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      pAigNew->pReprs[pAVar9->Id] = pAVar10;
      if (((*(uint *)&pAVar9->field_0x18 & 0xffffffc0) == 0) &&
         (iVar4 = Dch_ObjCheckTfi(pAigNew,pAVar9,pAVar10), iVar4 == 0)) {
        if ((fSkipRedSupps != 0) &&
           (iVar4 = Dch_ObjCheckSuppRed(pAigNew,pAVar9,pAVar10), iVar4 != 0)) {
          return;
        }
        do {
          piVar1 = &pAVar10->Id;
          pAVar10 = pAigNew->pEquivs[*piVar1];
        } while (pAVar10 != (Aig_Obj_t *)0x0);
        pAigNew->pEquivs[*piVar1] = pAVar9;
      }
    }
  }
  return;
}

Assistant:

void Dch_DeriveChoiceAigNode( Aig_Man_t * pAigNew, Aig_Man_t * pAigOld, Aig_Obj_t * pObj, int fSkipRedSupps )
{
    Aig_Obj_t * pRepr, * pObjNew, * pReprNew;
    assert( !Aig_IsComplement(pObj) );
    // get the representative
    pRepr = Aig_ObjRepr( pAigOld, pObj );
    if ( pRepr != NULL && (Aig_ObjIsConst1(pRepr) || Aig_ObjIsCi(pRepr)) )
    {
        assert( pRepr->pData != NULL );
        pObj->pData = Aig_NotCond( (Aig_Obj_t *)pRepr->pData, pObj->fPhase ^ pRepr->fPhase );
        return;
    }
    // get the new node
    pObjNew = Aig_And( pAigNew, 
        Aig_ObjChild0CopyRepr(pAigNew, pObj), 
        Aig_ObjChild1CopyRepr(pAigNew, pObj) );
//    pObjNew = Aig_ObjGetRepr( pAigNew, pObjNew );
    while ( 1 ) 
    {
        Aig_Obj_t * pObjNew2 = pObjNew;
        pObjNew = Aig_ObjGetRepr( pAigNew, pObjNew2 );
        if ( pObjNew == pObjNew2 )
            break;
    }
//    assert( Aig_ObjRepr( pAigNew, pObjNew ) == NULL );
    // assign the copy
    assert( pObj->pData == NULL );
    pObj->pData = pObjNew;
    // skip those without reprs
    if ( pRepr == NULL )
        return;
    assert( pRepr->Id < pObj->Id );
    assert( Aig_ObjIsNode(pRepr) );
    // get the corresponding new nodes
    pObjNew  = Aig_Regular((Aig_Obj_t *)pObj->pData);
    pReprNew = Aig_Regular((Aig_Obj_t *)pRepr->pData);
    // skip earlier nodes
    if ( pReprNew->Id >= pObjNew->Id )
        return;
    assert( pReprNew->Id < pObjNew->Id );
    // set the representatives
    Aig_ObjSetRepr( pAigNew, pObjNew, pReprNew );
    // skip used nodes
    if ( pObjNew->nRefs > 0 )
        return;
    assert( pObjNew->nRefs == 0 );
    // skip choices that can lead to combo loops
    if ( Dch_ObjCheckTfi( pAigNew, pObjNew, pReprNew ) )
        return;
    // don't add choice if structural support of pObjNew and pReprNew differ
    if ( fSkipRedSupps && Dch_ObjCheckSuppRed(pAigNew, pObjNew, pReprNew) )
        return;
    // add choice to the end of the list
    while ( pAigNew->pEquivs[pReprNew->Id] != NULL )
        pReprNew = pAigNew->pEquivs[pReprNew->Id];
    assert( pAigNew->pEquivs[pReprNew->Id] == NULL );
    pAigNew->pEquivs[pReprNew->Id] = pObjNew;
}